

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
* __thiscall
asio::execution::
any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
::prefer<asio::execution::detail::outstanding_work::tracked_t<0>>
          (any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
           *this,tracked_t<0> *p,
          enable_if_t<find_convertible_preferable_property<tracked_t<>_>::value> *param_3)

{
  tracked_t<0> *p_00;
  long in_RSI;
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  *in_RDI;
  bad_executor ex;
  bad_executor *in_stack_ffffffffffffffa0;
  prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_> *this_00;
  undefined1 local_35 [53];
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    bad_executor::bad_executor(in_stack_ffffffffffffffa0);
    asio::detail::throw_exception<asio::execution::bad_executor>(in_stack_ffffffffffffffa0);
    bad_executor::~bad_executor((bad_executor *)0x4628ab);
  }
  this_00 = *(prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_> **)
             (*(long *)(in_RSI + 0x30) + 0x58);
  p_00 = (tracked_t<0> *)(**(code **)(*(long *)(in_RSI + 0x18) + 0x18))();
  prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>::prefer_only(this_00,p_00);
  (*(code *)this_00)(in_RDI,p_00,local_35);
  return in_RDI;
}

Assistant:

any_executor prefer(const Property& p,
      enable_if_t<
        find_convertible_preferable_property<Property>::value
      >* = 0) const
  {
    if (!target_)
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
    typedef find_convertible_preferable_property<Property> found;
    return prop_fns_[found::index].prefer(object_fns_->target(*this),
        &static_cast<const typename found::type&>(p));
  }